

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O0

void __thiscall
pstack::Dwarf::DIE::Children::const_iterator::const_iterator
          (const_iterator *this,DIE *first,DIE *parent_)

{
  Off OVar1;
  bool bVar2;
  element_type *peVar3;
  DIE *parent__local;
  DIE *first_local;
  const_iterator *this_local;
  
  std::shared_ptr<const_pstack::Dwarf::Unit>::shared_ptr(&this->u);
  DIE(&this->parent,parent_);
  DIE(&this->currentDIE,first);
  bVar2 = DIE::operator_cast_to_bool(&this->currentDIE);
  if (((bVar2) && (bVar2 = DIE::operator_cast_to_bool(&this->parent), bVar2)) &&
     (peVar3 = std::
               __shared_ptr_access<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->currentDIE).raw), peVar3->parent == 0)) {
    OVar1 = (this->parent).offset;
    peVar3 = std::
             __shared_ptr_access<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->currentDIE).raw);
    peVar3->parent = OVar1;
  }
  return;
}

Assistant:

DIE::Children::const_iterator::const_iterator(const DIE &first, const DIE & parent_)
    : parent(parent_)
    , currentDIE(first)
{
    // As above, take the opportunity to update the current DIE's parent field
    // if it has not already been decided.
    if (currentDIE && parent && currentDIE.raw->parent == 0)
        currentDIE.raw->parent = parent.offset;
}